

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refmap.c
# Opt level: O0

flatcc_refmap_ref_t flatcc_refmap_find(flatcc_refmap_t *refmap,void *src)

{
  flatcc_refmap_item *pfVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t k;
  size_t j;
  size_t i;
  size_t N;
  flatcc_refmap_item *T;
  void *src_local;
  flatcc_refmap_t *refmap_local;
  
  if (refmap->count != 0) {
    pfVar1 = refmap->table;
    sVar2 = refmap->buckets;
    sVar3 = _flatcc_refmap_hash(src);
    j = 0;
    sVar4 = sVar3;
    while (k = sVar4 & sVar2 - 1, pfVar1[k].src != (void *)0x0) {
      if (pfVar1[k].src == src) {
        return pfVar1[k].ref;
      }
      j = j + 1;
      sVar4 = sVar3 + j;
    }
  }
  return 0;
}

Assistant:

flatcc_refmap_ref_t flatcc_refmap_find(flatcc_refmap_t *refmap, const void *src)
{
    struct flatcc_refmap_item *T;
    size_t N, i, j, k;

    if (refmap->count == 0) {
        return flatcc_refmap_not_found;
    }
    T = refmap->table;
    N = refmap->buckets - 1;
    k = _flatcc_refmap_hash(src);
    i = 0;
    j = _flatcc_refmap_probe(k, i, N);
    while (T[j].src) {
        if (T[j].src == src) return T[j].ref;
        ++i;
        j = _flatcc_refmap_probe(k, i, N);
    }
    return flatcc_refmap_not_found;
}